

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::initiatorFixtureLogOn_RefreshOnLogonHelper::RunImpl
          (initiatorFixtureLogOn_RefreshOnLogonHelper *this)

{
  Message *pMVar1;
  Session *pSVar2;
  TestResults *this_00;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  Message receivedLogon;
  Message sentLogon;
  undefined **local_430;
  char *local_428;
  char *pcStack_420;
  undefined1 local_418 [16];
  char *pcStack_408;
  Logon local_2c0;
  Message local_168 [344];
  
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_date = 0x257e44;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = 0x1aa324d61000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_date = 0x268636;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_time = 0x354649ac2000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  (*(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
    _vptr_Responder[8])(this,1,0,0x1f);
  FIX::DateTime::nowUtc();
  (this->super_initiatorFixture).super_sessionFixture.object[0x243] = (Session)0x1;
  createLogon(&local_2c0,"TW","ISLD",1);
  FIX::Message::Message(local_168,(Message *)&local_2c0);
  FIX::Message::~Message((Message *)&local_2c0);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon((Logon *)local_418,"ISLD","TW",1);
  FIX::Message::Message((Message *)&local_2c0,(Message *)local_418);
  FIX::Message::~Message((Message *)local_418);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::DateTime::nowUtc();
  local_428 = (char *)local_418._8_8_;
  pcStack_420 = pcStack_408;
  local_430 = &PTR__DateTime_00326368;
  FIX::Session::next(pMVar1,(UtcTimeStamp *)&local_2c0,SUB81(&local_430,0));
  pSVar2 = (this->super_initiatorFixture).super_sessionFixture.object;
  if ((pSVar2[0x261] != (Session)0x1) || (((byte)pSVar2[0x263] & 1) == 0)) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)local_418,*ppTVar4,0x7ee);
    UnitTest::TestResults::OnTestFailure(this_00,(TestDetails *)local_418,"object->isLoggedOn()");
  }
  FIX::Message::~Message((Message *)&local_2c0);
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LogOn_RefreshOnLogon) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;
  object->setRefreshOnLogon(true);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  CHECK(object->isLoggedOn());
}